

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::ES5ArrayTypeHandlerBase<int>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<int> *this,Recycler *recycler,
          ES5ArrayTypeHandlerBase<int> *typeHandler)

{
  IndexPropertyDescriptorMap *pIVar1;
  
  DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<int>,recycler,
             &typeHandler->super_DictionaryTypeHandlerBase<int>);
  (this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler._vptr_DynamicTypeHandler =
       (_func_int **)&PTR_GetCppName_01550eb0;
  (this->indexPropertyMap).ptr = (IndexPropertyDescriptorMap *)0x0;
  this->dataItemAttributes = typeHandler->dataItemAttributes;
  this->lengthWritable = typeHandler->lengthWritable;
  pIVar1 = IndexPropertyDescriptorMap::Clone((typeHandler->indexPropertyMap).ptr,recycler);
  Memory::Recycler::WBSetBit((char *)&this->indexPropertyMap);
  (this->indexPropertyMap).ptr = pIVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->indexPropertyMap);
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler, ES5ArrayTypeHandlerBase<T>* typeHandler)
        : DictionaryTypeHandlerBase<T>(recycler, typeHandler)
    {
        dataItemAttributes = typeHandler->dataItemAttributes;
        lengthWritable = typeHandler->lengthWritable;
        indexPropertyMap = typeHandler->indexPropertyMap->Clone(recycler);
    }